

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * createTableStmt(sqlite3 *db,Table *p)

{
  short sVar1;
  _func_void_sqlite3_str_ptr_char_ptr_int *__s;
  uint uVar2;
  char *zBuf;
  size_t sVar3;
  Column *pCVar4;
  int iVar5;
  char *pcVar6;
  char *zFormat;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = p->nCol;
  if (0 < sVar1) {
    pCVar4 = p->aCol;
    iVar5 = 0;
    iVar8 = 0;
LAB_001800b6:
    pcVar6 = pCVar4->zCnName;
    iVar7 = 0;
    do {
      if (*pcVar6 == '\"') {
        iVar7 = iVar7 + 1;
      }
      else if (*pcVar6 == '\0') goto LAB_001800d5;
      iVar7 = iVar7 + 1;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  iVar7 = 2;
LAB_001800f2:
  pcVar6 = p->zName;
  iVar5 = 0;
  do {
    if (*pcVar6 == '\"') {
      iVar5 = iVar5 + 1;
    }
    else if (*pcVar6 == '\0') {
      iVar7 = iVar7 + iVar5;
      pcVar6 = ",\n  ";
      if (iVar7 < 0x32) {
        pcVar6 = ",";
      }
      pcVar9 = "\n)";
      if (iVar7 < 0x32) {
        pcVar9 = ")";
      }
      iVar5 = iVar7 + 0x23 + sVar1 * 6;
      zBuf = (char *)sqlite3Malloc((long)iVar5);
      if (zBuf == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        sqlite3_snprintf(iVar5,zBuf,"CREATE TABLE ");
        sVar3 = strlen(zBuf);
        local_3c = (uint)sVar3 & 0x3fffffff;
        identPut(zBuf,(int *)&local_3c,p->zName);
        uVar2 = local_3c + 1;
        zBuf[(int)local_3c] = '(';
        if (0 < p->nCol) {
          pCVar4 = p->aCol;
          zFormat = "\n  ";
          if (iVar7 < 0x32) {
            zFormat = "";
          }
          iVar7 = 0;
          do {
            sqlite3_snprintf(iVar5 - uVar2,zBuf + (int)uVar2,zFormat);
            sVar3 = strlen(zBuf + (int)uVar2);
            local_3c = uVar2 + ((uint)sVar3 & 0x3fffffff);
            identPut(zBuf,(int *)&local_3c,pCVar4->zCnName);
            __s = (&sqlite3Apis.str_append)[pCVar4->affinity];
            sVar3 = strlen((char *)__s);
            uVar2 = local_3c;
            memcpy(zBuf + (int)local_3c,__s,(ulong)((uint)sVar3 & 0x3fffffff));
            uVar2 = uVar2 + ((uint)sVar3 & 0x3fffffff);
            iVar7 = iVar7 + 1;
            pCVar4 = pCVar4 + 1;
            zFormat = pcVar6;
            local_3c = uVar2;
          } while (iVar7 < p->nCol);
        }
        sqlite3_snprintf(iVar5 - uVar2,zBuf + (int)uVar2,"%s",pcVar9);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return zBuf;
      }
      __stack_chk_fail();
    }
    iVar5 = iVar5 + 1;
    pcVar6 = pcVar6 + 1;
  } while( true );
LAB_001800d5:
  iVar7 = iVar8 + iVar7;
  iVar8 = iVar7 + 7;
  iVar5 = iVar5 + 1;
  pCVar4 = pCVar4 + 1;
  if (iVar5 == sVar1) goto code_r0x001800e6;
  goto LAB_001800b6;
code_r0x001800e6:
  iVar7 = iVar7 + 9;
  goto LAB_001800f2;
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zCnName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL",
        /* SQLITE_AFF_FLEXNUM */ " NUM",
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zCnName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    testcase( pCol->affinity==SQLITE_AFF_FLEXNUM );

    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB
            || pCol->affinity==SQLITE_AFF_FLEXNUM
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}